

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int quicly_open_stream(quicly_conn_t *conn,quicly_stream_t **_stream,int uni)

{
  quicly_stream_t *pqVar1;
  int in_EDX;
  undefined8 *in_RSI;
  long *in_RDI;
  int ret;
  uint64_t max_stream_data_remote;
  uint32_t max_stream_data_local;
  uint64_t *max_stream_count;
  st_quicly_conn_streamgroup_state_t *group;
  quicly_stream_t *stream;
  quicly_linklist_t *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint32_t initial_max_stream_data_local;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  quicly_conn_t *conn_00;
  long *local_30;
  int local_4;
  
  if (in_EDX == 0) {
    local_30 = in_RDI + 0x29;
    conn_00 = (quicly_conn_t *)(in_RDI + 0xd9);
    uVar2 = (undefined4)*(undefined8 *)(*in_RDI + 0x20);
    initial_max_stream_data_local = (uint32_t)((ulong)in_RDI[0x53] >> 0x20);
  }
  else {
    local_30 = in_RDI + 0x2b;
    conn_00 = (quicly_conn_t *)(in_RDI + 0xd4);
    uVar2 = 0;
    initial_max_stream_data_local = (uint32_t)((ulong)in_RDI[0x54] >> 0x20);
  }
  pqVar1 = open_stream(conn_00,CONCAT44(uVar2,in_stack_ffffffffffffffc0),
                       initial_max_stream_data_local,
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (pqVar1 == (quicly_stream_t *)0x0) {
    local_4 = 0x201;
  }
  else {
    *(int *)local_30 = (int)*local_30 + 1;
    local_30[1] = local_30[1] + 4;
    if ((conn_00->super).ctx <= (quicly_context_t *)(pqVar1->stream_id / 4)) {
      pqVar1->field_0xb8 = pqVar1->field_0xb8 & 0xfe | 1;
      if (in_EDX == 0) {
        in_stack_ffffffffffffffa8 = (quicly_linklist_t *)(in_RDI + 0xf3);
      }
      else {
        in_stack_ffffffffffffffa8 = (quicly_linklist_t *)(in_RDI + 0xf1);
      }
      quicly_linklist_insert
                ((quicly_linklist_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffa8);
    }
    QUICLY_TRACER_STREAM_ON_OPEN
              ((st_quicly_conn_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (int64_t)in_stack_ffffffffffffffa8,(st_quicly_stream_t *)0x13e5a0);
    local_4 = (*(code *)**(undefined8 **)(*in_RDI + 0xb0))(*(undefined8 *)(*in_RDI + 0xb0),pqVar1);
    if (local_4 == 0) {
      *in_RSI = pqVar1;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int quicly_open_stream(quicly_conn_t *conn, quicly_stream_t **_stream, int uni)
{
    quicly_stream_t *stream;
    struct st_quicly_conn_streamgroup_state_t *group;
    uint64_t *max_stream_count;
    uint32_t max_stream_data_local;
    uint64_t max_stream_data_remote;
    int ret;

    /* determine the states */
    if (uni) {
        group = &conn->super.local.uni;
        max_stream_count = &conn->egress.max_streams.uni.count;
        max_stream_data_local = 0;
        max_stream_data_remote = conn->super.remote.transport_params.max_stream_data.uni;
    } else {
        group = &conn->super.local.bidi;
        max_stream_count = &conn->egress.max_streams.bidi.count;
        max_stream_data_local = (uint32_t)conn->super.ctx->transport_params.max_stream_data.bidi_local;
        max_stream_data_remote = conn->super.remote.transport_params.max_stream_data.bidi_remote;
    }

    /* open */
    if ((stream = open_stream(conn, group->next_stream_id, max_stream_data_local, max_stream_data_remote)) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    ++group->num_streams;
    group->next_stream_id += 4;

    /* adjust blocked */
    if (stream->stream_id / 4 >= *max_stream_count) {
        stream->streams_blocked = 1;
        quicly_linklist_insert((uni ? &conn->egress.pending_streams.blocked.uni : &conn->egress.pending_streams.blocked.bidi)->prev,
                               &stream->_send_aux.pending_link.control);
    }

    /* application-layer initialization */
    QUICLY_PROBE(STREAM_ON_OPEN, conn, conn->stash.now, stream);
    if ((ret = conn->super.ctx->stream_open->cb(conn->super.ctx->stream_open, stream)) != 0)
        return ret;

    *_stream = stream;
    return 0;
}